

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O0

void Saig_MvPrintState(int Iter,Saig_MvMan_t *p)

{
  int iVar1;
  void *pvVar2;
  int local_24;
  int i;
  Saig_MvObj_t *pEntry;
  Saig_MvMan_t *p_local;
  int Iter_local;
  
  printf("%3d : ",(ulong)(uint)Iter);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vFlops), local_24 < iVar1; local_24 = local_24 + 1) {
    pvVar2 = Vec_PtrEntry(p->vFlops,local_24);
    if (*(uint *)((long)pvVar2 + 8) >> 3 == 0x1ffffffe) {
      printf("    *");
    }
    else {
      printf("%5d",(ulong)(*(uint *)((long)pvVar2 + 8) >> 3));
    }
  }
  printf("\n");
  return;
}

Assistant:

void Saig_MvPrintState( int Iter, Saig_MvMan_t * p )
{
    Saig_MvObj_t * pEntry;
    int i;
    printf( "%3d : ", Iter );
    Vec_PtrForEachEntry( Saig_MvObj_t *, p->vFlops, pEntry, i )
    {
        if ( pEntry->Value == SAIG_UNDEF_VALUE )
            printf( "    *" );
        else
            printf( "%5d", pEntry->Value );
    }
    printf( "\n" );
}